

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRUndef * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::allocate<unsigned_int&>
          (ObjectPool<spirv_cross::SPIRUndef> *this,uint *p)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRUndef_*,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
  _Var2;
  ulong uVar3;
  uint uVar4;
  _Head_base<0UL,_spirv_cross::SPIRUndef_*,_false> _Var5;
  SPIRUndef *pSVar6;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size == 0) {
    uVar4 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar3 = (ulong)uVar4;
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>)malloc(uVar3 << 4);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl !=
        (SPIRUndef *)0x0) {
      _Var5._M_head_impl =
           (SPIRUndef *)_Var2.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
      if (uVar4 != 0) {
        do {
          SmallVector<spirv_cross::SPIRUndef_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.ptr[sVar1] = _Var5._M_head_impl
          ;
          (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size = sVar1 + 1;
          uVar3 = uVar3 - 1;
          _Var5._M_head_impl = _Var5._M_head_impl + 1;
        } while (uVar3 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRUndef_*,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl !=
          (SPIRUndef *)0x0) goto LAB_002cd1bc;
    }
    pSVar6 = (SPIRUndef *)0x0;
  }
  else {
LAB_002cd1bc:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
    pSVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRUndef_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    uVar4 = *p;
    (pSVar6->super_IVariant).self.id = 0;
    (pSVar6->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0035c8d0;
    *(uint *)&(pSVar6->super_IVariant).field_0xc = uVar4;
  }
  return pSVar6;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}